

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_NtkDelayTraceCritPathCollect_rec
               (Vec_Int_t *vSlacks,Abc_Obj_t *pNode,Vec_Int_t *vBest,Vec_Ptr_t *vPath)

{
  int iVar1;
  uint i;
  Abc_Obj_t *pNode_00;
  int iFanin;
  Vec_Ptr_t *vPath_local;
  Vec_Int_t *vBest_local;
  Abc_Obj_t *pNode_local;
  Vec_Int_t *vSlacks_local;
  
  iVar1 = Abc_ObjIsCi(pNode);
  if (iVar1 == 0) {
    iVar1 = Abc_ObjIsNode(pNode);
    if (iVar1 == 0) {
      __assert_fail("Abc_ObjIsCi(pNode) || Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                    ,0x36c,
                    "void Abc_NtkDelayTraceCritPathCollect_rec(Vec_Int_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Ptr_t *)"
                   );
    }
  }
  iVar1 = Abc_ObjIsNode(pNode);
  if (iVar1 != 0) {
    i = Abc_ObjId(pNode);
    iVar1 = Vec_IntEntry(vBest,i);
    if (iVar1 < 0) {
      __assert_fail("iFanin >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                    ,0x370,
                    "void Abc_NtkDelayTraceCritPathCollect_rec(Vec_Int_t *, Abc_Obj_t *, Vec_Int_t *, Vec_Ptr_t *)"
                   );
    }
    pNode_00 = Abc_ObjFanin(pNode,iVar1);
    Abc_NtkDelayTraceCritPathCollect_rec(vSlacks,pNode_00,vBest,vPath);
  }
  Vec_PtrPush(vPath,pNode);
  return;
}

Assistant:

void Abc_NtkDelayTraceCritPathCollect_rec( Vec_Int_t * vSlacks, Abc_Obj_t * pNode, Vec_Int_t * vBest, Vec_Ptr_t * vPath )
{
    assert( Abc_ObjIsCi(pNode) || Abc_ObjIsNode(pNode) );
    if ( Abc_ObjIsNode(pNode) )
    {
        int iFanin = Vec_IntEntry( vBest, Abc_ObjId(pNode) );
        assert( iFanin >= 0 );
        Abc_NtkDelayTraceCritPathCollect_rec( vSlacks, Abc_ObjFanin(pNode, iFanin), vBest, vPath );
    }
    Vec_PtrPush( vPath, pNode );
}